

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

MatcherDescriberInterface *
testing::internal::MatcherBase<long>::
GetDescriberImpl<testing::internal::MatcherBase<long>::ValuePolicy<testing::internal::EqMatcher<long>,true>>
          (MatcherBase<long> *m)

{
  __tuple_element_t<0UL,_tuple<const_MatcherBase<long>_*,_const_EqMatcher<long>_*>_> *ppMVar1;
  MatcherBase<long> *local_28;
  tuple<const_testing::internal::MatcherBase<long>_*,_const_testing::internal::EqMatcher<long>_*>
  local_20;
  MatcherBase<long> *local_10;
  MatcherBase<long> *m_local;
  
  local_28 = m;
  local_10 = m;
  ValuePolicy<testing::internal::EqMatcher<long>,_true>::Get(m);
  std::
  make_tuple<testing::internal::MatcherBase<long>const*,testing::internal::EqMatcher<long>const*>
            ((MatcherBase<long> **)&local_20,(EqMatcher<long> **)&local_28);
  ppMVar1 = std::
            get<0ul,testing::internal::MatcherBase<long>const*,testing::internal::EqMatcher<long>const*>
                      (&local_20);
  return &(*ppMVar1)->super_MatcherDescriberInterface;
}

Assistant:

static const MatcherDescriberInterface* GetDescriberImpl(
      const MatcherBase& m) {
    // If the impl is a MatcherDescriberInterface, then return it.
    // Otherwise use MatcherBase itself.
    // This allows us to implement the GetDescriber() function without support
    // from the impl, but some users really want to get their impl back when
    // they call GetDescriber().
    // We use std::get on a tuple as a workaround of not having `if constexpr`.
    return std::get<(
        std::is_convertible<decltype(&P::Get(m)),
                            const MatcherDescriberInterface*>::value
            ? 1
            : 0)>(std::make_tuple(&m, &P::Get(m)));
  }